

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGlitch.c
# Opt level: O3

void Gli_ManSetDataSaved(Gli_Man_t *p,int iBit)

{
  uint *puVar1;
  int *piVar2;
  uint uVar3;
  long lVar4;
  int iVar5;
  Vec_Int_t *pVVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  bool bVar11;
  
  pVVar6 = p->vCis;
  if (0 < pVVar6->nSize) {
    lVar4 = 0;
    do {
      piVar2 = p->pObjData;
      if (piVar2 == (int *)0x0) break;
      bVar11 = (p->pSimInfoPrev[lVar4] >> (iBit & 0x1fU) & 1) != 0;
      piVar2[pVVar6->pArray[lVar4]] =
           (piVar2[pVVar6->pArray[lVar4]] & 0xfffffff9U) + (uint)bVar11 * 4 + (uint)bVar11 * 2;
      lVar4 = lVar4 + 1;
      pVVar6 = p->vCis;
    } while (lVar4 < pVVar6->nSize);
  }
  iVar5 = p->nObjData;
  if (0 < iVar5) {
    uVar3 = 0;
    do {
      if (p->pObjData == (int *)0x0) {
        return;
      }
      puVar1 = (uint *)(p->pObjData + uVar3);
      uVar8 = *puVar1;
      if ((uVar8 & 1) == 0) {
        uVar10 = uVar8 >> 4 & 7;
        if (uVar10 == 0) {
          uVar9 = 0;
        }
        else {
          uVar7 = 0;
          uVar9 = 0;
          do {
            uVar9 = uVar9 | (puVar1[-(long)(int)puVar1[uVar7 + 7]] >> 1 & 1) << ((byte)uVar7 & 0x1f)
            ;
            uVar7 = uVar7 + 1;
          } while (uVar10 != uVar7);
        }
        bVar11 = (*(uint *)(*(long *)(puVar1 + 2) + (long)((int)uVar9 >> 5) * 4) >> (uVar9 & 0x1f) &
                 1) != 0;
        uVar8 = (uVar8 & 0xfffffff8) + (uint)bVar11 * 4 + (uint)bVar11 * 2;
        *puVar1 = uVar8;
        iVar5 = p->nObjData;
      }
      uVar3 = uVar3 + (uVar8 >> 7) + (uVar8 >> 4 & 7) + 8;
    } while ((int)uVar3 < iVar5);
  }
  return;
}

Assistant:

void Gli_ManSetDataSaved( Gli_Man_t * p, int iBit )
{
    Gli_Obj_t * pObj;
    int i;
    Gli_ManForEachCi( p, pObj, i )
        pObj->fPhase = pObj->fPhase2 = ((p->pSimInfoPrev[i] >> iBit) & 1);
    Gli_ManForEachNode( p, pObj, i )
        pObj->fPhase = pObj->fPhase2 = Gli_NodeComputeValue( pObj );
}